

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O2

void __thiscall
jaegertracing::propagation::
Propagator<opentracing::v3::HTTPHeadersReader_const&,opentracing::v3::HTTPHeadersWriter_const&>::
inject(Propagator<opentracing::v3::HTTPHeadersReader_const&,opentracing::v3::HTTPHeadersWriter_const&>
       *this)

{
  HTTPHeadersWriter *in_RDX;
  SpanContext *in_RSI;
  
  Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  ::inject((Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
            *)(this + -8),in_RSI,in_RDX);
  return;
}

Assistant:

void inject(const SpanContext& ctx, const Writer& writer) const override
    {
        std::ostringstream oss;
        oss << ctx;
        writer.Set(_headerKeys.traceContextHeaderName(), oss.str());
        ctx.forEachBaggageItem(
            [this, &writer](const std::string& key, const std::string& value) {
                const auto safeKey = addBaggageKeyPrefix(key);
                const auto safeValue = encodeValue(value);
                writer.Set(safeKey, safeValue);
                return true;
            });
    }